

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O0

void Js::CacheOperators::CachePropertyReadForGetter
               (PropertyValueInfo *info,Var originalInstance,PropertyId propertyId,
               ScriptContext *requestContext)

{
  code *pcVar1;
  DynamicObject *objectWithProperty;
  Var info_00;
  bool bVar2;
  PropertyIndex propertyIndex;
  TypeId typeId;
  RecyclableObject *pRVar3;
  undefined4 *puVar4;
  DynamicType *this;
  DynamicTypeHandler *this_00;
  ScriptContext *pSVar5;
  Type *type;
  DynamicObject *local_58;
  bool local_4b;
  PropertyIndex local_4a;
  bool isProto;
  bool isInlineSlot;
  DynamicObject *pDStack_48;
  PropertyIndex slotIndex;
  DynamicObject *dynamicInstance;
  RecyclableObject *originalObj;
  ScriptContext *requestContext_local;
  RecyclableObject *pRStack_28;
  PropertyId propertyId_local;
  Var originalInstance_local;
  PropertyValueInfo *info_local;
  
  originalObj = (RecyclableObject *)requestContext;
  requestContext_local._4_4_ = propertyId;
  pRStack_28 = (RecyclableObject *)originalInstance;
  originalInstance_local = info;
  info_local = (PropertyValueInfo *)originalInstance;
  bVar2 = VarIs<Js::RecyclableObject>(originalInstance);
  if (bVar2) {
    local_58 = (DynamicObject *)UnsafeVarTo<Js::RecyclableObject>(info_local);
  }
  else {
    local_58 = (DynamicObject *)0x0;
  }
  info_00 = originalInstance_local;
  dynamicInstance = local_58;
  if ((originalInstance_local != (Var)0x0) && (local_58 != (DynamicObject *)0x0)) {
    pRVar3 = PropertyValueInfo::GetInstance((PropertyValueInfo *)originalInstance_local);
    bVar2 = CanCachePropertyRead((PropertyValueInfo *)info_00,pRVar3,(ScriptContext *)originalObj);
    if (bVar2) {
      pRVar3 = PropertyValueInfo::GetInstance((PropertyValueInfo *)originalInstance_local);
      typeId = RecyclableObject::GetTypeId(pRVar3);
      bVar2 = DynamicType::Is(typeId);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                    ,0x75,"(DynamicType::Is(info->GetInstance()->GetTypeId()))",
                                    "DynamicType::Is(info->GetInstance()->GetTypeId())");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pRVar3 = PropertyValueInfo::GetInstance((PropertyValueInfo *)originalInstance_local);
      pDStack_48 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar3);
      this = DynamicObject::GetDynamicType(pDStack_48);
      this_00 = DynamicType::GetTypeHandler(this);
      propertyIndex =
           PropertyValueInfo::GetPropertyIndex((PropertyValueInfo *)originalInstance_local);
      DynamicTypeHandler::PropertyIndexToInlineOrAuxSlotIndex
                (this_00,propertyIndex,&local_4a,&local_4b);
      pRVar3 = PropertyValueInfo::GetInstance((PropertyValueInfo *)originalInstance_local);
      bVar2 = pRVar3 != pRStack_28;
      if ((!bVar2) ||
         (pSVar5 = RecyclableObject::GetScriptContext(&dynamicInstance->super_RecyclableObject),
         pSVar5 == (ScriptContext *)originalObj)) {
        objectWithProperty = pDStack_48;
        type = RecyclableObject::GetType(&dynamicInstance->super_RecyclableObject);
        Cache<true,true,false>
                  (bVar2,objectWithProperty,false,type,(Type *)0x0,requestContext_local._4_4_,
                   local_4a,(bool)(local_4b & 1),false,0,(PropertyValueInfo *)originalInstance_local
                   ,(ScriptContext *)originalObj);
      }
    }
  }
  return;
}

Assistant:

void CacheOperators::CachePropertyReadForGetter(
        PropertyValueInfo *info,
        Var originalInstance,
        PropertyId propertyId,
        ScriptContext* requestContext)
    {
        RecyclableObject* originalObj = JavascriptOperators::TryFromVar<RecyclableObject>(originalInstance);
        if (!info || !originalObj || !CacheOperators::CanCachePropertyRead(info, info->GetInstance(), requestContext))
        {
            return;
        }

        Assert(DynamicType::Is(info->GetInstance()->GetTypeId()));

        DynamicObject * dynamicInstance = VarTo<DynamicObject>(info->GetInstance());
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicInstance->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(info->GetPropertyIndex(), &slotIndex, &isInlineSlot);

        const bool isProto = info->GetInstance() != originalInstance;
        if (isProto && originalObj->GetScriptContext() != requestContext)
        {
            // Don't need to cache if the beginning property is number etc.
            return;
        }

#ifdef TELEMETRY_AddToCache
        if (info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
        {
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(info->GetInstance(), propertyId, nullptr);
            }
        }
#endif


        Cache<true, true, false>(
            isProto,
            dynamicInstance,
            false,
            originalObj->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            false,
            0,
            info,
            requestContext);
    }